

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

NamedVar * __thiscall
despot::Parser::CreateObsVar(NamedVar *__return_storage_ptr__,Parser *this,TiXmlElement *e_ObsVar)

{
  int iVar1;
  char *pcVar2;
  TiXmlNode *pTVar3;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  int local_d8;
  allocator<char> local_d1;
  int num;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string value_enum_list;
  allocator<char> local_55 [13];
  string local_48 [8];
  string name;
  TiXmlElement *e_ObsVar_local;
  Parser *this_local;
  NamedVar *obs;
  
  name.field_2._M_local_buf[0xf] = '\0';
  NamedVar::NamedVar(__return_storage_ptr__);
  pcVar2 = util::tinyxml::TiXmlElement::Attribute(e_ObsVar,"vname");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,pcVar2,local_55);
  std::allocator<char>::~allocator(local_55);
  std::__cxx11::string::string((string *)(value_enum_list.field_2._M_local_buf + 8),local_48);
  NamedVar::name(__return_storage_ptr__,(string *)((long)&value_enum_list.field_2 + 8));
  std::__cxx11::string::~string((string *)(value_enum_list.field_2._M_local_buf + 8));
  pTVar3 = util::tinyxml::TiXmlNode::FirstChild(&e_ObsVar->super_TiXmlNode,"ValueEnum");
  if (pTVar3 == (TiXmlNode *)0x0) {
    GetFirstChildText_abi_cxx11_(&local_f8,this,e_ObsVar,"NumValues");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(pcVar2);
    std::__cxx11::string::~string((string *)&local_f8);
    local_d8 = iVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"o",&local_119);
    Variable::values(&__return_storage_ptr__->super_Variable,&local_118,local_d8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  else {
    GetFirstChildText_abi_cxx11_
              ((string *)
               &values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this,e_ObsVar,"ValueEnum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&num," ",&local_d1);
    Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b0,
             (string *)
             &values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&num);
    std::__cxx11::string::~string((string *)&num);
    std::allocator<char>::~allocator(&local_d1);
    Variable::values(&__return_storage_ptr__->super_Variable,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
    std::__cxx11::string::~string
              ((string *)
               &values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  name.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_48);
  if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
    NamedVar::~NamedVar(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ObsVar Parser::CreateObsVar(TiXmlElement* e_ObsVar) {
	ObsVar obs;

	// <vname>
	string name = e_ObsVar->Attribute("vname");
	obs.name(name);

	// <ValueEnum> or <NumValues>
	if (e_ObsVar->FirstChild("ValueEnum")) {
		string value_enum_list = GetFirstChildText(e_ObsVar, "ValueEnum");
		vector<string> values = Tokenize(value_enum_list);
		obs.values(values);
	} else {
		int num = atoi(GetFirstChildText(e_ObsVar, "NumValues").c_str());
		obs.values("o", num);
	}

	return obs;
}